

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QObject*,QObject*>::emplace<QObject*const&>
          (QHash<QObject*,QObject*> *this,QObject **key,QObject **args)

{
  Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QObject_*,_QObject_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QObject_*,_QObject_*>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *)0x0) {
    local_28.d = (Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *)0x0;
LAB_002c54d3:
    pDVar1 = (Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *)0x0;
LAB_002c54f4:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QObject_*,_QObject_*>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<QObject_*,_QObject_*>_> **)this = pDVar1;
LAB_002c54fc:
    pVar2 = (piter)emplace_helper<QObject*const&>(this,key,args);
    QHash<QObject_*,_QObject_*>::~QHash(&local_28);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_28.d = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QObject_*,_QObject_*>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *)0x0) goto LAB_002c54d3;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_002c54f4;
      goto LAB_002c54fc;
    }
    if (((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)&pDVar1->size)->d <
        (QObjectData *)(pDVar1->numBuckets >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QObject*const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_002c557b;
    }
    local_28.d = (Data *)*args;
    pVar2 = (piter)emplace_helper<QObject*>(this,key,(QObject **)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_002c557b:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }